

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_cookie.cpp
# Opt level: O2

string * __thiscall
cppcms::http::cookie::name_abi_cxx11_(string *__return_storage_ptr__,cookie *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name_);
  return __return_storage_ptr__;
}

Assistant:

std::string cookie::name() const { return name_; }